

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

void __thiscall QMakeEvaluator::applyExtraConfigs(QMakeEvaluator *this)

{
  storage_type *psVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QArrayDataPointer<char16_t> QStack_c8;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QStringBuilder<QString,_QString> local_80;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_extraConfigs).super_QList<ProString>.d.size != 0) {
    psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("CONFIG += ",0xb);
    QVar2.m_data = psVar1;
    QVar2.m_size = (qsizetype)&local_98;
    QString::fromLatin1(QVar2);
    ProStringList::join((QString *)&local_b0,&this->m_extraConfigs,(QChar)0x20);
    QStringBuilder<QString,_QString>::QStringBuilder
              (&local_80,(QString *)&local_98,(QString *)&local_b0);
    QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_50,&local_80);
    psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("(extra configs)",0x10);
    QVar3.m_data = psVar1;
    QVar3.m_size = (qsizetype)&QStack_c8;
    QString::fromLatin1(QVar3);
    evaluateCommand(this,(QString *)&local_50,(QString *)&QStack_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::applyExtraConfigs()
{
    if (m_extraConfigs.isEmpty())
        return;

    evaluateCommand(fL1S("CONFIG += ") + m_extraConfigs.join(QLatin1Char(' ')), fL1S("(extra configs)"));
}